

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int changedir(int f,int n)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char local_418 [8];
  char bufc [1024];
  
  strlcpy(local_418,mgcwd,0x400);
  iVar1 = 0;
  pcVar2 = eread("Change default directory: ",local_418,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 2;
  }
  else if (*pcVar2 != '\0') {
    iVar1 = chdir(local_418);
    if (iVar1 == -1) {
      dobeep();
      iVar1 = 0;
      ewprintf("Can\'t change dir to %s",local_418);
    }
    else {
      pcVar2 = getcwd(mgcwd,0x400);
      if (pcVar2 == (char *)0x0) {
        if (local_418[0] == '/') {
          strlcpy(mgcwd,local_418,0x400);
        }
        else {
          strlcat(mgcwd,local_418,0x400);
        }
      }
      sVar3 = strlen(mgcwd);
      if (*(char *)((long)&listbuf_ncol + sVar3 + 3) != '/') {
        strlcat(mgcwd,"/",0x400);
      }
      ewprintf("Current directory is now %s",mgcwd);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int
changedir(int f, int n)
{
	char	bufc[NFILEN], *bufp;

	(void)strlcpy(bufc, mgcwd, sizeof(bufc));
	if ((bufp = eread("Change default directory: ", bufc, NFILEN,
	    EFDEF | EFNEW | EFCR | EFFILE)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	/* Append trailing slash */
	if (chdir(bufc) == -1) {
		dobeep();
		ewprintf("Can't change dir to %s", bufc);
		return (FALSE);
	}
	if ((bufp = getcwd(mgcwd, sizeof(mgcwd))) == NULL) {
		if (bufc[0] == '/')
			(void)strlcpy(mgcwd, bufc, sizeof(mgcwd));
		else
			(void)strlcat(mgcwd, bufc, sizeof(mgcwd));
	}
	if (mgcwd[strlen(mgcwd) - 1] != '/')
		(void)strlcat(mgcwd, "/", sizeof(mgcwd));
	ewprintf("Current directory is now %s", mgcwd);
	return (TRUE);
}